

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_div_m68k(floatx80 a,floatx80 b,float_status *status)

{
  uint64_t b_00;
  uint64_t b_01;
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ulong b_02;
  ulong uVar6;
  ulong a0;
  long lVar7;
  bool bVar8;
  floatx80 fVar9;
  uint local_54;
  uint64_t term1;
  undefined4 local_44;
  uint64_t term2;
  uint64_t term0;
  
  b_02 = b.low;
  uVar6 = a.low;
  uVar1 = CONCAT71(b.low._1_7_,-1 < (long)uVar6);
  if (-1 < (long)uVar6 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_0064ff8b:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar9._10_6_ = (int6)(uVar1 >> 0x10);
    fVar9.high = 0x7fff;
    fVar9.low = 0xffffffffffffffff;
    return fVar9;
  }
  uVar1 = CONCAT71(b.low._1_7_,-1 < (long)b_02);
  uVar3 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)b_02)
  goto LAB_0064ff8b;
  uVar2 = b._8_4_ ^ a._8_4_;
  uVar1 = (ulong)uVar2;
  if ((a.high & 0x7fff) == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
LAB_0064fffd:
      fVar9 = propagateFloatx80NaN_m68k(a,b,status);
      return fVar9;
    }
    if (uVar3 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_0064ff8b;
      goto LAB_0064fffd;
    }
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
      uVar4 = (uint)uVar3;
      if (uVar3 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
        goto LAB_0064fffd;
      }
      else {
LAB_00650029:
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
          local_54 = a._8_4_ & 0x7fff;
LAB_00650059:
          local_44 = (undefined4)((uVar1 & 0xffff) >> 0xf);
          uVar1 = 0;
          if (b_02 <= uVar6) {
            uVar1 = uVar6 << 0x3f;
          }
          a0 = uVar6 >> (b_02 <= uVar6);
          b_00 = estimateDiv128To64(a0,uVar1,b_02);
          mul64To128(b_02,b_00,&term0,&term1);
          uVar5 = uVar1 - term1;
          for (lVar7 = (a0 - term0) - (ulong)(uVar1 < term1); lVar7 < 0;
              lVar7 = lVar7 + (ulong)bVar8) {
            b_00 = b_00 - 1;
            bVar8 = CARRY8(uVar5,b_02);
            uVar5 = uVar5 + b_02;
          }
          b_01 = estimateDiv128To64(uVar5,0,b_02);
          if (b_01 * 2 < 9) {
            mul64To128(b_02,b_01,&term1,&term2);
            uVar1 = -term2;
            for (lVar7 = (-term1 - (ulong)(term2 != 0)) + uVar5; lVar7 < 0;
                lVar7 = lVar7 + (ulong)bVar8) {
              b_01 = b_01 - 1;
              bVar8 = CARRY8(uVar1,b_02);
              uVar1 = uVar1 + b_02;
            }
            b_01 = b_01 | (uVar1 != 0 || lVar7 != 0);
          }
          fVar9 = roundAndPackFloatx80_m68k
                            (status->floatx80_rounding_precision,(flag)local_44,
                             (local_54 - uVar4) + (b_02 <= uVar6 | 0x3ffe),b_00,b_01,status);
          return fVar9;
        }
        if (uVar6 != 0) {
          uVar5 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar6 = uVar6 << ((byte)(uVar5 ^ 0x3f) & 0x3f);
          local_54 = 1 - (int)(uVar5 ^ 0x3f);
          goto LAB_00650059;
        }
      }
      uVar2 = uVar2 & 0x8000;
      goto LAB_0065017a;
    }
    if (b_02 != 0) {
      uVar5 = 0x3f;
      if (b_02 != 0) {
        for (; b_02 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      b_02 = b_02 << ((byte)(uVar5 ^ 0x3f) & 0x3f);
      uVar4 = 1 - (int)(uVar5 ^ 0x3f);
      goto LAB_00650029;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar6 == 0)
    goto LAB_0064ff8b;
    status->float_exception_flags = status->float_exception_flags | 4;
  }
  uVar2 = uVar2 | 0x7fff;
LAB_0065017a:
  return (floatx80)(ZEXT416(uVar2) << 0x40);
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}